

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::VerifyLoopGraph(FlowGraph *this)

{
  Loop *this_00;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  Loop *loop;
  code *pcVar2;
  FlowGraph *pFVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Type *ppFVar8;
  BasicBlock *pBVar9;
  BasicBlock *pBVar10;
  char *message;
  char *error;
  BasicBlock *this_01;
  Iterator local_50;
  uint local_3c;
  FlowGraph *local_38;
  
  this_01 = (BasicBlock *)&this->blockList;
  local_38 = this;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_003f88a9:
  do {
    this_01 = this_01->next;
    if (this_01 == (BasicBlock *)0x0) {
      return;
    }
  } while ((this_01->field_0x18 & 1) != 0);
  this_00 = this_01->loop;
  local_50.list =
       &(this_01->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_50.current = &(local_50.list)->super_SListNodeBase<Memory::ArenaAllocator>;
LAB_003f88cf:
  if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
      (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) goto LAB_003f8b3a;
    *puVar7 = 0;
  }
  pFVar3 = local_38;
  pSVar1 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
           (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&(local_50.current)->next)
           ->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if (pSVar1 == local_50.list) goto LAB_003f8a5d;
  local_50.current = (NodeBase *)pSVar1;
  ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_50);
  pBVar10 = (*ppFVar8)->succBlock;
  if (pBVar10 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xf6f,"(succ)","succ");
    if (!bVar4) goto LAB_003f8b3a;
    *puVar7 = 0;
  }
  loop = pBVar10->loop;
  if (this_00 == loop) goto LAB_003f89ca;
  if ((*(ushort *)&pBVar10->field_0x18 & 4) == 0) {
    if ((loop != (Loop *)0x0) && (bVar4 = Loop::IsDescendentOrSelf(loop,this_00), !bVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      uVar5 = 0xf7c;
      error = "(succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop))";
      message = "succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop)";
      goto LAB_003f8a43;
    }
    goto LAB_003f88cf;
  }
  if ((loop->parent == this_00) || (bVar4 = Loop::IsDescendentOrSelf(this_00,loop), !bVar4))
  goto LAB_003f88cf;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar7 = 1;
  uVar5 = 0xf79;
  error = "(succ->loop->parent == loop || (!loop->IsDescendentOrSelf(succ->loop)))";
  message = "succ->loop->parent == loop || (!loop->IsDescendentOrSelf(succ->loop))";
  goto LAB_003f8a43;
LAB_003f8a5d:
  local_3c = Func::GetSourceContextId(local_38->func);
  uVar5 = Func::GetLocalFunctionId(pFVar3->func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,RemoveBreakBlockPhase,local_3c,uVar5);
  if ((((!bVar4) && (this_00 != (Loop *)0x0)) && ((this_01->field_0x18 & 4) == 0)) &&
     ((BVar6 = Func::HasTry(local_38->func), BVar6 == 0 ||
      (bVar4 = Func::DoOptimizeTry(local_38->func), bVar4)))) {
    pBVar10 = BasicBlock::GetPrev(this_01);
    bVar4 = Loop::IsDescendentOrSelf(this_00,pBVar10->loop);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xf84,"(loop->IsDescendentOrSelf(block->GetPrev()->loop))",
                         "loop->IsDescendentOrSelf(block->GetPrev()->loop)");
      if (!bVar4) {
LAB_003f8b3a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
  }
  goto LAB_003f88a9;
LAB_003f89ca:
  if (((*(ushort *)&pBVar10->field_0x18 & 4) == 0) ||
     (pBVar9 = Loop::GetHeadBlock(this_00), pBVar9 == pBVar10)) goto LAB_003f88cf;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar7 = 1;
  uVar5 = 0xf73;
  error = "(succ->isLoopHeader == false || loop->GetHeadBlock() == succ)";
  message = "succ->isLoopHeader == false || loop->GetHeadBlock() == succ";
LAB_003f8a43:
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                     ,uVar5,error,message);
  if (!bVar4) goto LAB_003f8b3a;
  *puVar7 = 0;
  goto LAB_003f88cf;
}

Assistant:

FOREACH_BLOCK(block, this)
    {
        Loop *loop = block->loop;
        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (loop == succ->loop)
            {
                Assert(succ->isLoopHeader == false || loop->GetHeadBlock() == succ);
                continue;
            }
            if (succ->isLoopHeader)
            {
                Assert(succ->loop->parent == loop
                    || (!loop->IsDescendentOrSelf(succ->loop)));
                continue;
            }
            Assert(succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop));
        } NEXT_SUCCESSOR_BLOCK;

        if (!PHASE_OFF(Js::RemoveBreakBlockPhase, this->GetFunc()))
        {
            // Make sure all break blocks have been removed.
            if (loop && !block->isLoopHeader && !(this->func->HasTry() && !this->func->DoOptimizeTry()))
            {
                Assert(loop->IsDescendentOrSelf(block->GetPrev()->loop));
            }
        }
    }